

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PClass::PClass(PClass *this)

{
  FName local_24;
  PClass *local_20;
  
  local_24.Index = 0;
  PNativeStruct::PNativeStruct(&this->super_PNativeStruct,&local_24);
  (this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  super_PTypeBase.super_DObject._vptr_DObject = &PTR_StaticType_006ee230;
  (this->SpecialInits).Array = (pair<const_PType_*,_unsigned_int> *)0x0;
  (this->SpecialInits).Most = 0;
  (this->SpecialInits).Count = 0;
  (this->Virtuals).Array = (VMFunction **)0x0;
  (this->Virtuals).Most = 0;
  (this->Virtuals).Count = 0;
  *(undefined4 *)
   ((long)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
           super_PType.super_PTypeBase.super_DObject + 0x24) = 0x28;
  (this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  HashNext = (PType *)0x0;
  this->ConstructNative = (_func_void_void_ptr *)0x0;
  this->ParentClass = (PClass *)0x0;
  this->Pointers = (size_t *)0x0;
  this->FlatPointers = (size_t *)0x0;
  this->Defaults = (BYTE *)0x0;
  *(undefined4 *)((long)&this->Defaults + 7) = 0;
  FString::operator=(&(this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType
                      .super_PType.mDescriptiveName,"Class");
  local_20 = this;
  TArray<PClass_*,_PClass_*>::Push(&AllClasses,&local_20);
  return;
}

Assistant:

PClass::PClass()
{
	Size = sizeof(DObject);
	ParentClass = nullptr;
	Pointers = nullptr;
	FlatPointers = nullptr;
	HashNext = nullptr;
	Defaults = nullptr;
	bRuntimeClass = false;
	bExported = false;
	bDecorateClass = false;
	ConstructNative = nullptr;
	mDescriptiveName = "Class";

	PClass::AllClasses.Push(this);
}